

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::draw(list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
       *this,canvas *c)

{
  list_box_style *plVar1;
  data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *pdVar2;
  rectangle *prVar3;
  long lVar4;
  unsigned_long i;
  ulong uVar5;
  long lVar6;
  long lVar7;
  rectangle r;
  rectangle area;
  
  scrollable_region::draw(&this->super_scrollable_region,c);
  prVar3 = scrollable_region::display_rect(&this->super_scrollable_region);
  rectangle::intersect(prVar3,&c->super_rectangle);
  if ((area.t <= area.b) && (area.l <= area.r)) {
    plVar1 = (this->style)._M_t.
             super___uniq_ptr_impl<dlib::list_box_style,_std::default_delete<dlib::list_box_style>_>
             ._M_t.
             super__Tuple_impl<0UL,_dlib::list_box_style_*,_std::default_delete<dlib::list_box_style>_>
             .super__Head_base<0UL,_dlib::list_box_style_*,_false>._M_head_impl;
    prVar3 = scrollable_region::display_rect(&this->super_scrollable_region);
    (*plVar1->_vptr_list_box_style[2])
              (plVar1,c,prVar3,(ulong)(this->super_scrollable_region).super_drawable.enabled);
    prVar3 = scrollable_region::total_rect(&this->super_scrollable_region);
    lVar6 = 0;
    lVar7 = prVar3->t;
    for (uVar5 = 0; uVar5 < (this->items).array_size; uVar5 = uVar5 + 1) {
      lVar4 = *(long *)((long)&((this->items).array_elements)->height + lVar6) + lVar7;
      if (area.t < lVar4) {
        prVar3 = scrollable_region::total_rect(&this->super_scrollable_region);
        lVar4 = prVar3->l;
        prVar3 = scrollable_region::display_rect(&this->super_scrollable_region);
        r.r = prVar3->r;
        r.b = *(long *)((long)&((this->items).array_elements)->height + lVar6) + lVar7 + -1;
        plVar1 = (this->style)._M_t.
                 super___uniq_ptr_impl<dlib::list_box_style,_std::default_delete<dlib::list_box_style>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dlib::list_box_style_*,_std::default_delete<dlib::list_box_style>_>
                 .super__Head_base<0UL,_dlib::list_box_style_*,_false>._M_head_impl;
        r.l = lVar4;
        r.t = lVar7;
        prVar3 = scrollable_region::display_rect(&this->super_scrollable_region);
        pdVar2 = (this->items).array_elements;
        (*plVar1->_vptr_list_box_style[5])
                  (plVar1,c,&r,prVar3,(ulong)(this->super_scrollable_region).super_drawable.enabled,
                   (this->super_scrollable_region).super_drawable.mfont.
                   super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (long)&(pdVar2->name)._M_dataplus._M_p + lVar6,
                   (ulong)(&pdVar2->is_selected)[lVar6]);
        lVar4 = lVar7 + *(long *)((long)&((this->items).array_elements)->height + lVar6);
        if (area.b < lVar4) {
          return;
        }
      }
      lVar6 = lVar6 + 0x38;
      lVar7 = lVar4;
    }
  }
  return;
}

Assistant:

void list_box<S>::
    draw (
        const canvas& c
    ) const
    {
        scrollable_region::draw(c);

        rectangle area = display_rect().intersect(c);
        if (area.is_empty())
            return;

        style->draw_list_box_background(c, display_rect(), enabled);

        long y = total_rect().top();
        for (unsigned long i = 0; i < items.size(); ++i)
        {
            if (y+(long)items[i].height <= area.top())
            {
                y += items[i].height;
                continue;
            }

            rectangle r(total_rect().left(), y, display_rect().right(), y+items[i].height-1);

            style->draw_list_box_item(c,r, display_rect(), enabled, *mfont, items[i].name, items[i].is_selected);


            y += items[i].height;

            if (y > area.bottom())
                break;
        }
    }